

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCount.cpp
# Opt level: O3

int countChildElements(DOMNode *n,bool printOutEncounteredEles)

{
  char cVar1;
  int iVar2;
  wchar16 *pwVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  DOMNode *n_00;
  uint uVar9;
  undefined7 in_register_00000031;
  char *name_1;
  char *name;
  char *local_58;
  undefined4 local_4c;
  DOMNode *local_48;
  long local_40;
  char *local_38;
  
  if (n == (DOMNode *)0x0) {
    uVar9 = 0;
  }
  else {
    iVar2 = (**(code **)(*(long *)n + 0x20))();
    if (iVar2 == 1 && printOutEncounteredEles) {
      pwVar3 = (wchar16 *)(**(code **)(*(long *)n + 0x10))(n);
      pcVar4 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_38 = pcVar4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"----------------------------------------------------------",
                 0x3a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Encountered Element : ",0x16);
      local_4c = (undefined4)CONCAT71(in_register_00000031,printOutEncounteredEles);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107078);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      xercesc_4_0::XMLString::release(&local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_48 = n;
      cVar1 = (**(code **)(*(long *)n + 0xd0))(n);
      if (cVar1 != '\0') {
        plVar6 = (long *)(**(code **)(*(long *)local_48 + 0x58))();
        lVar7 = (**(code **)(*plVar6 + 0x28))(plVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tAttributes",0xb)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t----------",0xb)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        local_40 = lVar7;
        if (lVar7 != 0) {
          lVar7 = 0;
          do {
            plVar8 = (long *)(**(code **)(*plVar6 + 0x18))(plVar6,lVar7);
            pwVar3 = (wchar16 *)(**(code **)(*plVar8 + 0x140))(plVar8);
            local_58 = (char *)xercesc_4_0::XMLString::transcode
                                         (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            pcVar4 = local_58;
            if (local_58 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107078);
            }
            else {
              sVar5 = strlen(local_58);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=",1);
            xercesc_4_0::XMLString::release
                      (&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            pwVar3 = (wchar16 *)(**(code **)(*plVar8 + 0x150))(plVar8);
            pcVar4 = (char *)xercesc_4_0::XMLString::transcode
                                       (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            local_58 = pcVar4;
            if (pcVar4 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107078);
            }
            else {
              sVar5 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5)
              ;
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            xercesc_4_0::XMLString::release
                      (&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            lVar7 = lVar7 + 1;
          } while (local_40 != lVar7);
        }
      }
      uVar9 = 1;
      printOutEncounteredEles = SUB41(local_4c,0);
      n = local_48;
    }
    else {
      uVar9 = (uint)(iVar2 == 1);
    }
    for (n_00 = (DOMNode *)(**(code **)(*(long *)n + 0x38))(n); n_00 != (DOMNode *)0x0;
        n_00 = (DOMNode *)(**(code **)(*(long *)n_00 + 0x50))(n_00)) {
      iVar2 = countChildElements(n_00,printOutEncounteredEles);
      uVar9 = uVar9 + iVar2;
    }
  }
  return uVar9;
}

Assistant:

static int countChildElements(DOMNode *n, bool printOutEncounteredEles)
{
    DOMNode *child;
    int count = 0;
    if (n) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE)
		{
            if(printOutEncounteredEles) {
                char *name = XMLString::transcode(n->getNodeName());
                std::cout <<"----------------------------------------------------------"<<std::endl;
                std::cout <<"Encountered Element : "<< name << std::endl;

                XMLString::release(&name);

                if(n->hasAttributes()) {
                    // get all the attributes of the node
                    DOMNamedNodeMap *pAttributes = n->getAttributes();
                    const XMLSize_t nSize = pAttributes->getLength();
                    std::cout <<"\tAttributes" << std::endl;
                    std::cout <<"\t----------" << std::endl;
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        // get attribute name
                        char *name = XMLString::transcode(pAttributeNode->getName());

                        std::cout << "\t" << name << "=";
                        XMLString::release(&name);

                        // get attribute type
                        name = XMLString::transcode(pAttributeNode->getValue());
                        std::cout << name << std::endl;
                        XMLString::release(&name);
                    }
                }
            }
			++count;
		}
        for (child = n->getFirstChild(); child != 0; child=child->getNextSibling())
            count += countChildElements(child, printOutEncounteredEles);
    }
    return count;
}